

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>_>
* __thiscall
nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
argument<(char)108,int>
          (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>_>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder)

{
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>
  *in_RCX;
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>
  *in_stack_ffffffffffffff08;
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>
  local_a8;
  value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
  local_61;
  undefined1 local_60 [8];
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>
  a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder_local;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  *this_local;
  
  a.read._M_invoker = (_Invoker_type)placeholder;
  std::__cxx11::string::string((string *)local_60,(string *)placeholder);
  std::function<std::shared_ptr<int>(std::__cxx11::string_const&)>::
  function<nonsugar::value_read<std::__cxx11::string,int,void>,void>
            ((function<std::shared_ptr<int>(std::__cxx11::string_const&)> *)
             (a.placeholder.field_2._M_local_buf + 8),&local_61);
  detail::
  tuple_append<std::tuple<>,nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>>
            (&local_a8,(detail *)((long)this + 0x42),(tuple<> *)local_60,in_RCX);
  detail::
  make_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>>>
            (__return_storage_ptr__,(detail *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this + 0x40),(tuple<> *)((long)this + 0x41),(tuple<> *)&local_a8,
             in_stack_ffffffffffffff08);
  std::
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>_>
  ::~tuple(&local_a8);
  detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>
  ::~argument((argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>
               *)local_60);
  return __return_storage_ptr__;
}

Assistant:

auto argument(String const &placeholder) const
    {
        detail::argument<String, OptionType, Option, Value> a {
            placeholder, value_read<String, typename detail::value_of<String, Value>::type>() };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, m_flags, m_subcommands,
            detail::tuple_append(m_arguments, std::move(a)));
    }